

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall ast::ForRangeStmt::~ForRangeStmt(ForRangeStmt *this)

{
  (this->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__ForRangeStmt_001698a0;
  if (this->target != (Identifier *)0x0) {
    (*(this->target->super_Expr).super_Node._vptr_Node[1])();
  }
  this->target = (Identifier *)0x0;
  if (this->iter != (RangeExpr *)0x0) {
    (*(this->iter->super_Expr).super_Node._vptr_Node[1])();
  }
  this->iter = (RangeExpr *)0x0;
  if (this->body != (BlockStmt *)0x0) {
    (*(this->body->super_Stmt).super_Node._vptr_Node[1])();
  }
  this->body = (BlockStmt *)0x0;
  token::Token::~Token(&this->tok);
  return;
}

Assistant:

~ForRangeStmt(){
        delete  target;
        target = nullptr;
        delete iter;
        iter = nullptr;
        delete body;
        body = nullptr;
    }